

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O0

_Bool borg_caution_teleport(wchar_t emergency,wchar_t turns)

{
  loc grid1;
  int iVar1;
  int iVar2;
  wchar_t wVar3;
  _Bool _Var4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  wchar_t wVar8;
  loc grid2;
  char *what;
  borg_grid *local_48;
  borg_grid *ag;
  wchar_t q_y;
  wchar_t q_x;
  wchar_t min;
  wchar_t dis;
  wchar_t p;
  wchar_t y;
  wchar_t x;
  wchar_t d;
  wchar_t i;
  wchar_t k;
  wchar_t n;
  wchar_t turns_local;
  wchar_t emergency_local;
  
  wVar3 = w_x;
  local_48 = borg_grids[borg.c.y] + borg.c.x;
  iVar5 = borg_panel_wid();
  wVar8 = w_y;
  iVar5 = wVar3 / iVar5;
  iVar6 = borg_panel_hgt();
  iVar6 = wVar8 / iVar6;
  if ((borg.trait[0xd3] == 0) || (borg.trait[0xd4] == 0)) {
    turns_local._3_1_ = false;
  }
  else {
    i = L'\0';
    for (d = L'\0'; d < L'd'; d = d + L'\x01') {
      for (x = L'\0'; x < L'd'; x = x + L'\x01') {
        do {
          do {
            iVar2 = borg.c.y;
            uVar7 = Rand_div(0xc9);
            iVar1 = borg.c.x;
            dis = iVar2 + uVar7 + L'\xffffff9c';
            uVar7 = Rand_div(0xc9);
            p = iVar1 + uVar7 + L'\xffffff9c';
            grid2 = loc(p,dis);
            grid1.y = borg.c.y;
            grid1.x = borg.c.x;
            wVar8 = distance(grid1,grid2);
          } while (wVar8 < L'2');
        } while (L'd' < wVar8);
        if (((((L'\0' < dis) && (dis < L'A')) && (L'\0' < p)) && (p < L'Å')) &&
           (((local_48 = borg_grids[dis] + p, local_48->feat != '\0' ||
             (((((borg_detect_wall[iVar6][iVar5] & 1U) != 1 ||
                ((borg_detect_wall[iVar6][iVar5 + 1] & 1U) != 1)) ||
               (((borg_detect_wall[iVar6 + 1][iVar5] & 1U) != 1 ||
                ((borg_detect_wall[iVar6 + 1][iVar5 + 1] & 1U) != 1)))) && (borg_t < 0x7d1)))) &&
            (((_Var4 = borg_cave_floor_bold(dis,p), _Var4 && (local_48->kill == '\0')) &&
             ((local_48->web & 1U) == 0)))))) break;
      }
      if ((local_48->feat == '\0') && (borg.trait[0x1c] < 0x1e)) {
        i = i + L'\x01';
      }
      else if (x < L'd') {
        wVar8 = borg_danger(dis,p,turns,true,false);
        if (borg.trait[0x1b] < wVar8) {
          i = i + L'\x01';
        }
      }
      else {
        i = i + L'\x01';
      }
    }
    if (emergency < i) {
      what = format("# No Teleport. scary squares: %d",(ulong)(uint)i);
      borg_note(what);
      turns_local._3_1_ = false;
    }
    else {
      turns_local._3_1_ = true;
    }
  }
  return turns_local._3_1_;
}

Assistant:

bool borg_caution_teleport(int emergency, int turns)
{
    int n, k, i, d, x, y, p;

    int dis = 100;
    int min = dis / 2;
    int q_x, q_y;

    borg_grid *ag = &borg_grids[borg.c.y][borg.c.x];

    /* Extract panel */
    q_x = w_x / borg_panel_wid();
    q_y = w_y / borg_panel_hgt();

    /* must have the ability */
    if (!borg.trait[BI_ATELEPORT] || !borg.trait[BI_AESCAPE])
        return false;

    /* Simulate 100 attempts */
    for (n = k = 0; k < 100; k++) {
        /* Pick a location */
        for (i = 0; i < 100; i++) {
            /* Pick a (possibly illegal) location */
            while (1) {
                y = rand_spread(borg.c.y, dis);
                x = rand_spread(borg.c.x, dis);
                d = distance(borg.c, loc(x, y));
                if ((d >= min) && (d <= dis))
                    break;
            }

            /* Ignore illegal locations */
            if ((y <= 0) || (y >= AUTO_MAX_Y - 1))
                continue;
            if ((x <= 0) || (x >= AUTO_MAX_X - 1))
                continue;

            /* Access */
            ag = &borg_grids[y][x];

            /* Skip unknown grids if explored, or been on level for a while,
             * otherwise, consider ok*/
            if (ag->feat == FEAT_NONE
                && ((borg_detect_wall[q_y + 0][q_x + 0] == true
                        && borg_detect_wall[q_y + 0][q_x + 1] == true
                        && borg_detect_wall[q_y + 1][q_x + 0] == true
                        && borg_detect_wall[q_y + 1][q_x + 1] == true)
                    || borg_t > 2000))
                continue;

            /* Skip walls */
            if (!borg_cave_floor_bold(y, x))
                continue;

            /* Skip monsters */
            if (ag->kill)
                continue;

            /* Skip webs */
            if (ag->web)
                continue;

            /* Stop looking */
            break;
        }

        /* If low level, unknown squares are scary */
        if (ag->feat == FEAT_NONE && borg.trait[BI_MAXHP] < 30) {
            n++;
            continue;
        }

        /* No location */
        /* in the real code it would keep trying but here we should */
        /* assume that there is unknown spots that you would be able */
        /* to go but may be dangerous. */
        if (i >= 100) {
            n++;
            continue;
        }

        /* Examine */
        p = borg_danger(y, x, turns, true, false);

        /* if *very* scary, do not allow jumps at all */
        if (p > borg.trait[BI_CURHP])
            n++;
    }

    /* Too much danger */
    /* in an emergency try with extra danger allowed */
    if (n > emergency) {
        borg_note(format("# No Teleport. scary squares: %d", n));
        return false;
    }
    /* Okay */
    return true;
}